

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaDec.cpp
# Opt level: O0

SRes crnlib::LzmaDec_DecodeToBuf
               (CLzmaDec *p,Byte *dest,SizeT *destLen,Byte *src,SizeT *srcLen,
               ELzmaFinishMode finishMode,ELzmaStatus *status)

{
  long lVar1;
  SRes SVar2;
  size_t __n;
  ELzmaFinishMode local_6c;
  SRes res;
  ELzmaFinishMode curFinishMode;
  SizeT dicPos;
  SizeT outSizeCur;
  SizeT inSizeCur;
  SizeT inSize;
  SizeT outSize;
  SizeT *pSStack_38;
  ELzmaFinishMode finishMode_local;
  SizeT *srcLen_local;
  Byte *src_local;
  SizeT *destLen_local;
  Byte *dest_local;
  CLzmaDec *p_local;
  
  inSize = *destLen;
  inSizeCur = *srcLen;
  *destLen = 0;
  *srcLen = 0;
  outSize._4_4_ = finishMode;
  pSStack_38 = srcLen;
  srcLen_local = (SizeT *)src;
  src_local = (Byte *)destLen;
  destLen_local = (SizeT *)dest;
  dest_local = (Byte *)p;
  while( true ) {
    outSizeCur = inSizeCur;
    if (*(long *)(dest_local + 0x30) == *(long *)(dest_local + 0x38)) {
      dest_local[0x30] = '\0';
      dest_local[0x31] = '\0';
      dest_local[0x32] = '\0';
      dest_local[0x33] = '\0';
      dest_local[0x34] = '\0';
      dest_local[0x35] = '\0';
      dest_local[0x36] = '\0';
      dest_local[0x37] = '\0';
    }
    lVar1 = *(long *)(dest_local + 0x30);
    if ((ulong)(*(long *)(dest_local + 0x38) - lVar1) < inSize) {
      dicPos = *(SizeT *)(dest_local + 0x38);
      local_6c = LZMA_FINISH_ANY;
    }
    else {
      dicPos = lVar1 + inSize;
      local_6c = outSize._4_4_;
    }
    SVar2 = LzmaDec_DecodeToDic((CLzmaDec *)dest_local,dicPos,(Byte *)srcLen_local,&outSizeCur,
                                local_6c,status);
    srcLen_local = (SizeT *)(outSizeCur + (long)srcLen_local);
    inSizeCur = inSizeCur - outSizeCur;
    *pSStack_38 = outSizeCur + *pSStack_38;
    __n = *(long *)(dest_local + 0x30) - lVar1;
    memcpy(destLen_local,(void *)(*(long *)(dest_local + 0x18) + lVar1),__n);
    destLen_local = (SizeT *)(__n + (long)destLen_local);
    inSize = inSize - __n;
    *(size_t *)src_local = __n + *(long *)src_local;
    if (SVar2 != 0) break;
    if ((__n == 0) || (inSize == 0)) {
      return 0;
    }
  }
  return SVar2;
}

Assistant:

SRes LzmaDec_DecodeToBuf(CLzmaDec* p, Byte* dest, SizeT* destLen, const Byte* src, SizeT* srcLen, ELzmaFinishMode finishMode, ELzmaStatus* status) {
  SizeT outSize = *destLen;
  SizeT inSize = *srcLen;
  *srcLen = *destLen = 0;
  for (;;) {
    SizeT inSizeCur = inSize, outSizeCur, dicPos;
    ELzmaFinishMode curFinishMode;
    SRes res;
    if (p->dicPos == p->dicBufSize)
      p->dicPos = 0;
    dicPos = p->dicPos;
    if (outSize > p->dicBufSize - dicPos) {
      outSizeCur = p->dicBufSize;
      curFinishMode = LZMA_FINISH_ANY;
    } else {
      outSizeCur = dicPos + outSize;
      curFinishMode = finishMode;
    }

    res = LzmaDec_DecodeToDic(p, outSizeCur, src, &inSizeCur, curFinishMode, status);
    src += inSizeCur;
    inSize -= inSizeCur;
    *srcLen += inSizeCur;
    outSizeCur = p->dicPos - dicPos;
    memcpy(dest, p->dic + dicPos, outSizeCur);
    dest += outSizeCur;
    outSize -= outSizeCur;
    *destLen += outSizeCur;
    if (res != 0)
      return res;
    if (outSizeCur == 0 || outSize == 0)
      return SZ_OK;
  }
}